

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonPP.cpp
# Opt level: O3

Value * ccd::Json::arrayFromString(Value *__return_storage_ptr__,string *jsonString)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  Value *pVVar5;
  Value *pVVar6;
  Type TVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  _Node *p_Var11;
  int *piVar12;
  ostream *poVar13;
  undefined8 uVar14;
  _Uninitialized<double,_true> _Var15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  char *pcVar19;
  ulong uVar20;
  char cVar21;
  long lVar22;
  int iVar23;
  double dVar24;
  Value subObject;
  double value_1;
  undefined1 local_c0 [64];
  _List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> local_80;
  double local_68;
  string local_60;
  Value *local_40;
  double local_38;
  
  setlocale(1,"C");
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80._M_impl._M_node._M_size = 0;
  cVar21 = (char)jsonString;
  local_80._M_impl._M_node.super__List_node_base._M_prev =
       local_80._M_impl._M_node.super__List_node_base._M_next;
  lVar8 = std::__cxx11::string::find(cVar21,0x5b);
  lVar9 = std::__cxx11::string::rfind(cVar21,0x5d);
  if ((lVar8 == -1) || (lVar9 == -1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"can\'t tell beginning or end of array",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    pcVar19 = local_c0 + 0x10;
    local_c0._16_4_ = 0xd0a0920;
    local_c0._8_8_ = 1.97626258336499e-323;
    local_c0._20_4_ = local_c0._20_4_ & 0xffffff00;
    local_c0._0_8_ = pcVar19;
    uVar10 = std::__cxx11::string::find_first_not_of((char *)jsonString,(ulong)pcVar19,lVar8 + 1);
    pVVar6 = __return_storage_ptr__;
    pVVar5 = local_40;
    if ((char *)local_c0._0_8_ != pcVar19) {
      operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
      pVVar6 = __return_storage_ptr__;
      pVVar5 = local_40;
    }
    while (local_40 = pVVar6, uVar10 != 0xffffffffffffffff) {
      uVar3 = jsonString->_M_string_length;
      if (uVar3 <= uVar10) {
LAB_0010e9e5:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_0010e9f6:
        std::__throw_out_of_range("stoi");
LAB_0010ea02:
        std::__throw_invalid_argument("stoi");
LAB_0010ea0e:
        std::__throw_invalid_argument("stod");
LAB_0010ea1a:
        uVar14 = std::__throw_out_of_range("stod");
        std::__cxx11::_List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::_M_clear
                  (&local_80);
        _Unwind_Resume(uVar14);
      }
      pcVar4 = (jsonString->_M_dataplus)._M_p;
      bVar1 = pcVar4[uVar10];
      if (bVar1 == 0x22) {
        lVar8 = std::__cxx11::string::find(cVar21,0x22);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
          p_Var11 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                    _M_create_node<std::__cxx11::string>
                              ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_80,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0);
          std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
          local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
          }
          uVar17 = lVar8 + 1;
          goto LAB_0010e4fa;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cant find end of value",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        goto LAB_0010e6ce;
      }
      uVar17 = uVar10;
      if (bVar1 != 0x7b) {
        if (bVar1 == 0x2d || (int)(char)bVar1 - 0x30U < 10) {
          lVar8 = 3;
          lVar9 = 0;
          do {
            lVar22 = lVar9;
            lVar16 = lVar8;
            uVar17 = uVar3;
            if ((uVar10 - uVar3) + 1 + lVar22 == 0) goto LAB_0010e9d7;
            lVar9 = lVar22 + 1;
            lVar8 = lVar16 + 1;
          } while ((int)pcVar4[lVar22 + uVar10 + 1] - 0x30U < 10);
          if (pcVar4[lVar22 + uVar10 + 1] != '.') {
            std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
            uVar14 = local_c0._0_8_;
            piVar12 = __errno_location();
            local_68 = (double)CONCAT44(local_68._4_4_,*piVar12);
            *piVar12 = 0;
            lVar8 = strtol((char *)uVar14,(char **)&local_60,10);
            if (local_60._M_dataplus._M_p != (pointer)uVar14) {
              if (((int)lVar8 == lVar8) && (*piVar12 != 0x22)) {
                if (*piVar12 == 0) {
                  *piVar12 = local_68._0_4_;
                }
                if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                  operator_delete((void *)local_c0._0_8_,
                                  CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
                }
                local_38 = (double)CONCAT44(local_38._4_4_,(int)lVar8);
                p_Var11 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                          _M_create_node<int&>
                                    ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                     &local_80,(int *)&local_38);
                uVar17 = uVar10 + lVar9;
                std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
                local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
                __return_storage_ptr__ = local_40;
                goto LAB_0010e4fa;
              }
              goto LAB_0010e9f6;
            }
            goto LAB_0010ea02;
          }
          uVar17 = uVar10 + lVar9 + 1;
          if (uVar3 <= uVar17) {
LAB_0010e9d7:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar17)
            ;
            goto LAB_0010e9e5;
          }
          if ((int)pcVar4[lVar22 + 2 + uVar10] - 0x30U < 10) {
            uVar20 = uVar10 + lVar9 + 2;
            uVar17 = uVar20;
            while( true ) {
              if (uVar3 <= uVar20) goto LAB_0010e9d7;
              if (9 < (int)pcVar4[lVar16 + uVar10] - 0x30U) break;
              uVar20 = uVar10 + lVar16 + 1;
              lVar16 = lVar16 + 1;
              uVar17 = uVar3;
            }
            std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
            uVar14 = local_c0._0_8_;
            piVar12 = __errno_location();
            iVar23 = *piVar12;
            *piVar12 = 0;
            dVar24 = strtod((char *)uVar14,(char **)&local_60);
            if (local_60._M_dataplus._M_p != (pointer)uVar14) {
              if (*piVar12 == 0) {
                *piVar12 = iVar23;
              }
              else if (*piVar12 == 0x22) goto LAB_0010ea1a;
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                local_68 = dVar24;
                operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1
                               );
                dVar24 = local_68;
              }
              local_38 = dVar24;
              p_Var11 = std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                        _M_create_node<double&>
                                  ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                   &local_80,&local_38);
              __return_storage_ptr__ = local_40;
              uVar17 = uVar10 + lVar16;
              std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
              local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
              goto LAB_0010e4fa;
            }
            goto LAB_0010ea0e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"exptected digit",0xf);
          __return_storage_ptr__ = local_40;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          goto LAB_0010e6ce;
        }
        if (0x6d < bVar1) {
          if (bVar1 == 0x6e) {
            iVar23 = std::__cxx11::string::compare((ulong)jsonString,uVar10,(char *)0x4);
            if (iVar23 == 0) {
              local_c0._0_8_ = (pointer)0x0;
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<decltype(nullptr)>
                        ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_80,
                         (void **)local_c0);
LAB_0010e4f3:
              uVar17 = uVar10 + 4;
              goto LAB_0010e4fa;
            }
          }
          else {
            if (bVar1 != 0x74) goto LAB_0010e8f5;
            iVar23 = std::__cxx11::string::compare((ulong)jsonString,uVar10,(char *)0x4);
            if (iVar23 == 0) {
              local_c0[0] = 1;
              p_Var11 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                        _M_create_node<bool>
                                  ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                   &local_80,(bool *)local_c0);
              std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
              local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
              goto LAB_0010e4f3;
            }
          }
LAB_0010e462:
          uVar17 = uVar10 + 1;
          goto LAB_0010e4fa;
        }
        if (bVar1 == 0x5b) {
          std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
          if ((double)local_c0._8_8_ == 0.0) {
            iVar23 = 0;
            iVar18 = 0;
          }
          else {
            uVar17 = uVar10 + local_c0._8_8_;
            _Var15._M_storage = 0.0;
            iVar18 = 0;
            iVar23 = 0;
            do {
              iVar18 = (uint)(*(char *)(local_c0._0_8_ + (long)_Var15._M_storage) == '[') + iVar18;
              iVar23 = (uint)(*(char *)(local_c0._0_8_ + (long)_Var15._M_storage) == ']') + iVar23;
              if (iVar18 == iVar23) {
                uVar17 = (long)_Var15._M_storage + uVar10;
                iVar23 = iVar18;
                break;
              }
              _Var15._M_storage = _Var15._M_storage + 1;
            } while ((double)local_c0._8_8_ != _Var15._M_storage);
          }
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
          }
          if (iVar18 == iVar23) {
            std::__cxx11::string::substr((ulong)&local_60,(ulong)jsonString);
            arrayFromString((Value *)local_c0,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            p_Var11 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                      _M_create_node<ccd::Json::Value>
                                ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                 &local_80,(Value *)local_c0);
            goto LAB_0010e238;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"could not tell end of new subObject",0x23);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          goto LAB_0010e6ce;
        }
        if (bVar1 == 0x66) {
          iVar23 = std::__cxx11::string::compare((ulong)jsonString,uVar10,(char *)0x5);
          if (iVar23 == 0) {
            local_c0._0_8_ = local_c0._0_8_ & 0xffffffffffffff00;
            std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
            emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                               &local_80,(bool *)local_c0);
            uVar17 = uVar10 + 5;
            goto LAB_0010e4fa;
          }
          goto LAB_0010e462;
        }
        pVVar5 = local_40;
        if (bVar1 != 0x5d) {
LAB_0010e8f5:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"invalid value ",0xe);
          if (jsonString->_M_string_length <= uVar10) goto LAB_0010e9e5;
          local_c0[0] = (jsonString->_M_dataplus)._M_p[uVar10];
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_c0,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," offset ",8);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::endl<char,std::char_traits<char>>(poVar13);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(jsonString->_M_dataplus)._M_p,jsonString->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar13);
LAB_0010e777:
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          goto LAB_0010e6ce;
        }
        break;
      }
      std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
      if ((double)local_c0._8_8_ == 0.0) {
        iVar23 = 0;
        iVar18 = 0;
      }
      else {
        uVar17 = uVar10 + local_c0._8_8_;
        _Var15._M_storage = 0.0;
        iVar18 = 0;
        iVar23 = 0;
        do {
          iVar18 = (uint)(*(char *)(local_c0._0_8_ + (long)_Var15._M_storage) == '{') + iVar18;
          iVar23 = (uint)(*(char *)(local_c0._0_8_ + (long)_Var15._M_storage) == '}') + iVar23;
          if (iVar18 == iVar23) {
            uVar17 = (long)_Var15._M_storage + uVar10;
            iVar23 = iVar18;
            break;
          }
          _Var15._M_storage = _Var15._M_storage + 1;
        } while ((double)local_c0._8_8_ != _Var15._M_storage);
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
      }
      if (iVar18 != iVar23) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"could not tell end of new subObject",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        goto LAB_0010e6ce;
      }
      std::__cxx11::string::substr((ulong)&local_60,(ulong)jsonString);
      objectFromString((Value *)local_c0,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      TVar7 = Value::type((Value *)local_c0);
      if (TVar7 == Null) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"subObject ist nullptr",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        std::ostream::flush();
        Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        std::__detail::__variant::
        _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
        ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                             *)(local_c0 + 8));
        goto LAB_0010e6ce;
      }
      p_Var11 = std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                _M_create_node<ccd::Json::Value>
                          ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&local_80,
                           (Value *)local_c0);
LAB_0010e238:
      std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
      local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
      uVar17 = uVar17 + 1;
      std::__detail::__variant::
      _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                           *)(local_c0 + 8));
LAB_0010e4fa:
      pcVar19 = local_c0 + 0x10;
      local_c0._16_4_ = 0xd0a0920;
      local_c0._8_8_ = 1.97626258336499e-323;
      local_c0._20_4_ = local_c0._20_4_ & 0xffffff00;
      local_c0._0_8_ = pcVar19;
      uVar10 = std::__cxx11::string::find_first_not_of((char *)jsonString,(ulong)pcVar19,uVar17);
      if ((char *)local_c0._0_8_ != pcVar19) {
        operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
      }
      if (jsonString->_M_string_length <= uVar10) goto LAB_0010e9e5;
      cVar2 = (jsonString->_M_dataplus)._M_p[uVar10];
      if (cVar2 != ',') {
        pVVar5 = local_40;
        if (cVar2 != ']') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"syntax error!",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::__cxx11::string::substr((ulong)local_c0,(ulong)jsonString);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_c0._0_8_,local_c0._8_8_);
          if ((char *)local_c0._0_8_ != pcVar19) {
            operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
          }
          goto LAB_0010e777;
        }
        break;
      }
      local_c0._16_4_ = 0xd0a0920;
      local_c0._8_8_ = 1.97626258336499e-323;
      local_c0._20_4_ = local_c0._20_4_ & 0xffffff00;
      local_c0._0_8_ = pcVar19;
      uVar10 = std::__cxx11::string::find_first_not_of((char *)jsonString,(ulong)pcVar19,uVar10 + 1)
      ;
      pVVar6 = local_40;
      pVVar5 = local_40;
      if ((char *)local_c0._0_8_ != pcVar19) {
        operator_delete((void *)local_c0._0_8_,CONCAT44(local_c0._20_4_,local_c0._16_4_) + 1);
        pVVar6 = local_40;
        pVVar5 = local_40;
      }
    }
    local_40 = pVVar5;
    std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
    vector<std::move_iterator<std::_List_iterator<ccd::Json::Value>>,void>
              ((vector<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)local_c0,
               (move_iterator<std::_List_iterator<ccd::Json::Value>_>)
               local_80._M_impl._M_node.super__List_node_base._M_next,
               (move_iterator<std::_List_iterator<ccd::Json::Value>_>)&local_80,
               (allocator_type *)&local_60);
    Value::Value(__return_storage_ptr__,(Array *)local_c0);
    std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::~vector
              ((vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)local_c0);
  }
LAB_0010e6ce:
  std::__cxx11::_List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::_M_clear(&local_80)
  ;
  return __return_storage_ptr__;
}

Assistant:

Value arrayFromString(const std::string& jsonString)
{
	// make shure that decimal delimiter is a dot '.'
	std::setlocale(LC_NUMERIC, "C");

	auto arrayValues = std::list<Value>{};

	// check the borders
	auto beginPos = jsonString.find_first_of('[');
	auto endPos = jsonString.find_last_of(']');

	// if borders can not be defined something is wrong
	if (beginPos == string::npos || endPos == string::npos) {
		cout << "can't tell beginning or end of array" << endl;
		return nullptr;
	}

	// offset is one position after the beginning border
	auto offset = beginPos + 1;

	// find the first character
	beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

	// if no usefull character could be found position is set to npos
	while (beginPos != string::npos) {
		offset = beginPos;
		// it could be ne new sub object
		if (jsonString.at(offset) == '{') {
			auto newBeginPos = offset;
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '{')
					openCount++;
				if (character == '}')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}

			// if everything went right, set the dataName and start a new
			// objectFromJson querry recursively
			auto subObject = objectFromString(jsonString.substr(newBeginPos,
				newEndPos - newBeginPos + 1));
			if (subObject.type() == Value::Type::Null) {
				std::cout << "subObject ist nullptr" << std::endl;
				return nullptr;
			}
			arrayValues.push_back(move(subObject));
			// set the offset to one position after the closing curly braces 
			offset = newEndPos + 1;
		}
		// it could be a string value
		else if (jsonString.at(offset) == '"') {
			// find the value borders
			auto beginOfValue = offset + 1;
			auto endOfValue = jsonString.find_first_of('"', offset + 1);
			if (endOfValue == string::npos) {
				cout << "cant find end of value" << endl;
				return nullptr;
			}

			// save the found value
			auto value = jsonString.substr(beginOfValue, endOfValue - beginOfValue);

			// add the found data to the object struct map
			arrayValues.emplace_back(move(value));

			// set the offset to one position after the end of value
			offset = endOfValue + 1;
		}
		// it could be a numerical value
		else if (isdigit(jsonString.at(offset)) || (jsonString.at(offset) == '-')) {
			auto tempPos = offset;
			offset++;
			while (isdigit(jsonString.at(offset))) {
				offset++;
			}

			if (jsonString.at(offset) == '.') {
				offset++;

				if (!isdigit(jsonString.at(offset))) {
					std::cout << "exptected digit" << std::endl;
					return nullptr;
				}
				offset++;
				while (isdigit(jsonString.at(offset))) {
					offset++;
				}
				//save the found double
				auto value = stod(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
			else {
				// save the found int
				auto value = stoi(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
		}
		//it could be an array
		else if (jsonString.at(offset) == '[') {
			
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '[')
					openCount++;
				if (character == ']')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}
			auto value = arrayFromString(jsonString.substr(offset));
			arrayValues.push_back(move(value));

			offset = newEndPos + 1;
		}
		else if (jsonString.at(offset) == ']') {
			break;
		}
		else if (jsonString.at(offset) == 't') {
			if (jsonString.compare(offset, 4, "true") == 0) {
				arrayValues.emplace_back(true);
				offset += 4;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'f') {
			if (jsonString.compare(offset, 5, "false") == 0) {
				arrayValues.emplace_back(false);
				offset += 5;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'n') {
			if (jsonString.compare(offset, 4, "null") == 0) {
				arrayValues.emplace_back(nullptr);
				offset += 4;
			}
			else
				offset++;
		}
		else {
			cout 	<< "invalid value " << jsonString.at(offset) 
				<< " offset " << offset << endl
				<< jsonString << std::endl;
			return nullptr;
		}

		// find the next character
		offset = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

		// is it a closing curly braces we reached the end of the object and we are done
		if (jsonString.at(offset) == ']')
			break;
		// if a comma is next more values are following
		else if (jsonString.at(offset) == ',') {
			beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset + 1);
			continue;
		}
		// else syntax error
		else {
			std::cout << "syntax error!" << std::endl;
			std::cout << jsonString.substr(offset);
			return nullptr;
		}
	}

	return Array { 
		std::make_move_iterator(std::begin(arrayValues)),
		std::make_move_iterator(std::end(arrayValues))
	};
}